

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void performance_tests(int loop_count)

{
  ostream *poVar1;
  int loop_count_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test Perf (with loop count ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,loop_count);
  std::operator<<(poVar1,")\n");
  anon_unknown.dwarf_2c832::test_performance(loop_count);
  return;
}

Assistant:

void performance_tests(const int loop_count)
{
#ifdef _DEBUG
    cout << "NOTE: running performance test in debug mode, performance may be slow!\n";
#endif
    cout << "Test Perf (with loop count " << loop_count << ")\n";
    test_performance(loop_count);
}